

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void __thiscall icu_63::TimeZoneFormat::~TimeZoneFormat(TimeZoneFormat *this)

{
  long *plVar1;
  long lVar2;
  
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__TimeZoneFormat_00398e58;
  if (this->fTimeZoneNames != (TimeZoneNames *)0x0) {
    (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[1])();
  }
  if (this->fTimeZoneGenericNames != (TimeZoneGenericNames *)0x0) {
    (*this->fTimeZoneGenericNames->_vptr_TimeZoneGenericNames[1])();
  }
  if (this->fTZDBTimeZoneNames != (TZDBTimeZoneNames *)0x0) {
    (*(this->fTZDBTimeZoneNames->super_TimeZoneNames).super_UObject._vptr_UObject[1])();
  }
  for (lVar2 = 0x9e; lVar2 != 0xa4; lVar2 = lVar2 + 1) {
    plVar1 = *(long **)((this->super_Format).actualLocale + lVar2 * 8 + -8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  UnicodeString::~UnicodeString(&this->fGMTPatternSuffix);
  UnicodeString::~UnicodeString(&this->fGMTPatternPrefix);
  UnicodeString::~UnicodeString(&this->fGMTZeroFormat);
  lVar2 = 0x3c0;
  do {
    UnicodeString::~UnicodeString((UnicodeString *)((this->super_Format).actualLocale + lVar2 + -8))
    ;
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0x240);
  UnicodeString::~UnicodeString(&this->fGMTPattern);
  Locale::~Locale(&this->fLocale);
  Format::~Format(&this->super_Format);
  return;
}

Assistant:

TimeZoneFormat::~TimeZoneFormat() {
    delete fTimeZoneNames;
    delete fTimeZoneGenericNames;
    delete fTZDBTimeZoneNames;
    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        delete fGMTOffsetPatternItems[i];
    }
}